

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
          (cmGeneratorExpressionDAGChecker *this,string *target,string *property,
          GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *parent)

{
  _Rb_tree_header *p_Var1;
  Snapshot snapshot;
  Snapshot local_68;
  cmCommandContext local_50;
  
  this->Parent = parent;
  std::__cxx11::string::string((string *)&this->Target,(string *)target);
  std::__cxx11::string::string((string *)&this->Property,(string *)property);
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Seen)._M_t._M_impl.super__Rb_tree_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Content = content;
  cmState::Snapshot::Snapshot(&local_68,(cmState *)0x0);
  local_50.Name._M_dataplus._M_p = (pointer)&local_50.Name.field_2;
  local_50.Name._M_string_length = 0;
  local_50.Name.field_2._M_local_buf[0] = '\0';
  local_50.Line = 0;
  snapshot.Position.Tree = local_68.Position.Tree;
  snapshot.State = local_68.State;
  snapshot.Position.Position = local_68.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->TransitivePropertiesOnly = false;
  Initialize(this);
  return;
}

Assistant:

cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker(
                const std::string &target,
                const std::string &property,
                const GeneratorExpressionContent *content,
                cmGeneratorExpressionDAGChecker *parent)
  : Parent(parent), Target(target), Property(property),
    Content(content), Backtrace(), TransitivePropertiesOnly(false)
{
  Initialize();
}